

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

istream * safeGetline(istream *is,string *t)

{
  int iVar1;
  sentry se;
  
  t->_M_string_length = 0;
  *(t->_M_dataplus)._M_p = '\0';
  std::istream::sentry::sentry((sentry *)&se,is,true);
  while( true ) {
    iVar1 = std::streambuf::sbumpc();
    if (iVar1 == -1) {
      if (t->_M_string_length == 0) {
        std::ios::setstate((int)is->_vptr_basic_istream[-3] + (int)is);
      }
      return is;
    }
    if (iVar1 == 10) break;
    if (iVar1 == 0xd) {
      iVar1 = std::streambuf::sgetc();
      if (iVar1 != 10) {
        return is;
      }
      std::streambuf::sbumpc();
      return is;
    }
    std::__cxx11::string::push_back((char)t);
  }
  return is;
}

Assistant:

std::istream &safeGetline(std::istream &is, std::string &t) {
    t.clear();

    // The characters in the stream are read one-by-one using a std::streambuf.
    // That is faster than reading them one-by-one using the std::istream.
    // Code that uses streambuf this way must be guarded by a sentry object.
    // The sentry object performs various tasks,
    // such as thread synchronization and updating the stream state.

    std::istream::sentry se(is, true);
    std::streambuf *sb = is.rdbuf();

    for (;;) {
        int c = sb->sbumpc();
        switch (c) {
        case '\n':
            return is;
        case '\r':
            if (sb->sgetc() == '\n') {
                sb->sbumpc();
            }
            return is;
        case std::streambuf::traits_type::eof():
            // Also handle the case when the last line has no line ending
            if (t.empty()) {
                is.setstate(std::ios::eofbit);
            }
            return is;
        default:
            t += (char)c;
        }
    }
}